

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QCss::ImportRule>::emplace<QCss::ImportRule_const&>
          (QMovableArrayOps<QCss::ImportRule> *this,qsizetype i,ImportRule *args)

{
  qsizetype *pqVar1;
  ImportRule **ppIVar2;
  ImportRule *pIVar3;
  Data *pDVar4;
  ImportRule *pIVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::ImportRule>).
           super_QArrayDataPointer<QCss::ImportRule>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_005e978b:
    pDVar6 = (args->href).d.d;
    pcVar7 = (args->href).d.ptr;
    qVar8 = (args->href).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    local_48.d = (args->media).d.d;
    local_48.ptr = (args->media).d.ptr;
    local_48.size = (args->media).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar10 = (this->super_QGenericArrayOps<QCss::ImportRule>).
             super_QArrayDataPointer<QCss::ImportRule>.size != 0;
    QArrayDataPointer<QCss::ImportRule>::detachAndGrow
              ((QArrayDataPointer<QCss::ImportRule> *)this,(uint)(i == 0 && bVar10),1,
               (ImportRule **)0x0,(QArrayDataPointer<QCss::ImportRule> *)0x0);
    pIVar5 = (this->super_QGenericArrayOps<QCss::ImportRule>).
             super_QArrayDataPointer<QCss::ImportRule>.ptr;
    if (i == 0 && bVar10) {
      pIVar5[-1].href.d.d = pDVar6;
      pIVar5[-1].href.d.ptr = pcVar7;
      pIVar5[-1].href.d.size = qVar8;
      pIVar5[-1].media.d.d = local_48.d;
      pIVar5[-1].media.d.ptr = local_48.ptr;
      pIVar5[-1].media.d.size = local_48.size;
      (this->super_QGenericArrayOps<QCss::ImportRule>).super_QArrayDataPointer<QCss::ImportRule>.ptr
           = pIVar5 + -1;
    }
    else {
      pIVar3 = pIVar5 + i;
      memmove(pIVar3 + 1,pIVar5 + i,
              ((this->super_QGenericArrayOps<QCss::ImportRule>).
               super_QArrayDataPointer<QCss::ImportRule>.size - i) * 0x30);
      (pIVar3->href).d.d = pDVar6;
      (pIVar3->href).d.ptr = pcVar7;
      (pIVar3->href).d.size = qVar8;
      (pIVar3->media).d.d = local_48.d;
      (pIVar3->media).d.ptr = local_48.ptr;
      (pIVar3->media).d.size = local_48.size;
    }
    local_48.size = 0;
    local_48.ptr = (QString *)0x0;
    local_48.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QCss::ImportRule>).
              super_QArrayDataPointer<QCss::ImportRule>.size;
    *pqVar1 = *pqVar1 + 1;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  }
  else {
    if (((this->super_QGenericArrayOps<QCss::ImportRule>).super_QArrayDataPointer<QCss::ImportRule>.
         size == i) &&
       (pIVar5 = (this->super_QGenericArrayOps<QCss::ImportRule>).
                 super_QArrayDataPointer<QCss::ImportRule>.ptr,
       (pDVar4->super_QArrayData).alloc - i !=
       ((long)((long)pIVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      pDVar6 = (args->href).d.d;
      pIVar5[i].href.d.d = pDVar6;
      pIVar5[i].href.d.ptr = (args->href).d.ptr;
      pIVar5[i].href.d.size = (args->href).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar9 = (args->media).d.d;
      pIVar5[i].media.d.d = pDVar9;
      pIVar5[i].media.d.ptr = (args->media).d.ptr;
      pIVar5[i].media.d.size = (args->media).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if ((i != 0) ||
         (pIVar5 = (this->super_QGenericArrayOps<QCss::ImportRule>).
                   super_QArrayDataPointer<QCss::ImportRule>.ptr,
         (ImportRule *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pIVar5)) goto LAB_005e978b;
      pDVar6 = (args->href).d.d;
      pIVar5[-1].href.d.d = pDVar6;
      pIVar5[-1].href.d.ptr = (args->href).d.ptr;
      pIVar5[-1].href.d.size = (args->href).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar9 = (args->media).d.d;
      pIVar5[-1].media.d.d = pDVar9;
      pIVar5[-1].media.d.ptr = (args->media).d.ptr;
      pIVar5[-1].media.d.size = (args->media).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppIVar2 = &(this->super_QGenericArrayOps<QCss::ImportRule>).
                 super_QArrayDataPointer<QCss::ImportRule>.ptr;
      *ppIVar2 = *ppIVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCss::ImportRule>).
              super_QArrayDataPointer<QCss::ImportRule>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }